

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSim2.c
# Opt level: O0

void Gia_Sim2ProcessRefined(Gia_Sim2_t *p,Vec_Int_t *vRefined)

{
  Gia_Man_t *p_00;
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  void *__ptr;
  uint *pSim_00;
  int local_34;
  int Key;
  int k;
  int i;
  int nTableSize;
  int *pTable;
  uint *pSim;
  Vec_Int_t *vRefined_local;
  Gia_Sim2_t *p_local;
  
  iVar1 = Vec_IntSize(vRefined);
  if (iVar1 != 0) {
    iVar1 = Vec_IntSize(vRefined);
    iVar1 = Abc_PrimeCudd(iVar1 / 3 + 1000);
    __ptr = calloc((long)iVar1,4);
    for (local_34 = 0; iVar2 = Vec_IntSize(vRefined), local_34 < iVar2; local_34 = local_34 + 1) {
      iVar2 = Vec_IntEntry(vRefined,local_34);
      pSim_00 = Gia_Sim2Data(p,iVar2);
      iVar3 = Gia_Sim2HashKey(pSim_00,p->nWords,iVar1);
      if (*(int *)((long)__ptr + (long)iVar3 * 4) == 0) {
        iVar4 = Gia_ObjRepr(p->pAig,iVar2);
        if (iVar4 != 0) {
          __assert_fail("Gia_ObjRepr(p->pAig, i) == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaSim2.c"
                        ,0x1e2,"void Gia_Sim2ProcessRefined(Gia_Sim2_t *, Vec_Int_t *)");
        }
        iVar4 = Gia_ObjNext(p->pAig,iVar2);
        if (iVar4 != 0) {
          __assert_fail("Gia_ObjNext(p->pAig, i) == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaSim2.c"
                        ,0x1e3,"void Gia_Sim2ProcessRefined(Gia_Sim2_t *, Vec_Int_t *)");
        }
        Gia_ObjSetRepr(p->pAig,iVar2,0xfffffff);
      }
      else {
        Gia_ObjSetNext(p->pAig,*(int *)((long)__ptr + (long)iVar3 * 4),iVar2);
        p_00 = p->pAig;
        iVar4 = Gia_ObjRepr(p->pAig,*(int *)((long)__ptr + (long)iVar3 * 4));
        Gia_ObjSetRepr(p_00,iVar2,iVar4);
        iVar4 = Gia_ObjRepr(p->pAig,iVar2);
        if (iVar4 == 0xfffffff) {
          Gia_ObjSetRepr(p->pAig,iVar2,*(int *)((long)__ptr + (long)iVar3 * 4));
        }
        iVar4 = Gia_ObjRepr(p->pAig,iVar2);
        if (iVar4 < 1) {
          __assert_fail("Gia_ObjRepr(p->pAig, i) > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaSim2.c"
                        ,0x1ec,"void Gia_Sim2ProcessRefined(Gia_Sim2_t *, Vec_Int_t *)");
        }
      }
      *(int *)((long)__ptr + (long)iVar3 * 4) = iVar2;
    }
    if (__ptr != (void *)0x0) {
      free(__ptr);
    }
  }
  return;
}

Assistant:

void Gia_Sim2ProcessRefined( Gia_Sim2_t * p, Vec_Int_t * vRefined )
{
    unsigned * pSim;
    int * pTable, nTableSize, i, k, Key;
    if ( Vec_IntSize(vRefined) == 0 )
        return;
    nTableSize = Abc_PrimeCudd( 1000 + Vec_IntSize(vRefined) / 3 );
    pTable = ABC_CALLOC( int, nTableSize );
    Vec_IntForEachEntry( vRefined, i, k )
    {
        pSim = Gia_Sim2Data( p, i );
        Key = Gia_Sim2HashKey( pSim, p->nWords, nTableSize );
        if ( pTable[Key] == 0 )
        {
            assert( Gia_ObjRepr(p->pAig, i) == 0 );
            assert( Gia_ObjNext(p->pAig, i) == 0 );
            Gia_ObjSetRepr( p->pAig, i, GIA_VOID );
        }
        else
        {
            Gia_ObjSetNext( p->pAig, pTable[Key], i );
            Gia_ObjSetRepr( p->pAig, i, Gia_ObjRepr(p->pAig, pTable[Key]) );
            if ( Gia_ObjRepr(p->pAig, i) == GIA_VOID )
                Gia_ObjSetRepr( p->pAig, i, pTable[Key] );
            assert( Gia_ObjRepr(p->pAig, i) > 0 );
        }
        pTable[Key] = i;
    }
/*
    Vec_IntForEachEntry( vRefined, i, k )
    {
        if ( Gia_ObjIsHead( p->pAig, i ) )
            Gia_Sim2ClassRefineOne( p, i );
    }
*/
    ABC_FREE( pTable );
}